

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O3

void __thiscall
directed_flag_complex_in_memory_computer::compute_filtration_t::operator()
          (compute_filtration_t *this,vertex_index_t *first_vertex,int size,
          pair<int,_float> *param_3)

{
  iterator __position;
  int iVar1;
  value_t *pvVar2;
  pair<int,_float> *ppVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  directed_flag_complex_cell_t cell;
  float local_6c;
  undefined **local_68;
  vertex_index_t *local_60;
  ulong local_58;
  unsigned_short *local_50;
  directed_flag_complex_boundary_cell_t local_48;
  
  uVar4 = (ulong)(uint)size;
  uVar5 = this->current_index + 1;
  this->current_index = uVar5;
  local_6c = 0.0;
  if (this->filtration_algorithm == (filtration_algorithm_t *)0x0) {
    uVar4 = 0;
  }
  else {
    local_68 = &PTR_vertex_0014e288;
    uVar5 = size - 2;
    if (uVar5 != cell_hasher_t::dimension) {
      cell_hasher_t::dimension = (unsigned_short)uVar5;
    }
    local_60 = first_vertex;
    iVar1 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
    if ((char)iVar1 == '\0') {
      (*this->filtration_algorithm->_vptr_filtration_algorithm_t[2])
                (this->filtration_algorithm,(ulong)(size - 1U & 0xffff),&local_68,this->graph);
      local_6c = extraout_XMM0_Da_00;
    }
    else {
      local_50 = first_vertex;
      if (this->boundary_filtration == (value_t *)0x0) {
        uVar6 = 0xffffffffffffffff;
        if (-1 < size) {
          uVar6 = uVar4 * 4;
        }
        pvVar2 = (value_t *)operator_new__(uVar6);
        this->boundary_filtration = pvVar2;
      }
      local_58 = uVar4;
      if (0 < size) {
        uVar6 = 0;
        do {
          local_48.super_directed_flag_complex_cell_t.vertices = local_60;
          local_48.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
               (_func_int **)&PTR_vertex_0014e2a0;
          local_48.i = uVar6;
          ppVar3 = directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
                   get_data<directed_flag_complex_boundary_cell_t>(this->complex,uVar5,&local_48);
          this->boundary_filtration[uVar6] = ppVar3->second;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      size = (int)local_58;
      (*this->filtration_algorithm->_vptr_filtration_algorithm_t[2])
                (this->filtration_algorithm,(ulong)(size - 1U & 0xffff),&local_68,this->graph);
      first_vertex = local_50;
      local_6c = extraout_XMM0_Da;
    }
    __position._M_current =
         (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)&this->next_filtration,__position,&local_6c)
      ;
    }
    else {
      *__position._M_current = local_6c;
      (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar5 = this->current_index;
    uVar4 = (ulong)(uint)local_6c << 0x20;
  }
  directed_flag_complex_cell_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
            ((directed_flag_complex_cell_in_memory_t<std::pair<int,float>> *)
             ((long)&((this->complex->vertex_cells).
                      super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->vertex +
             (ulong)((uint)*first_vertex * 0x18)),size + -1,first_vertex,
             (pair<int,_float>)(uVar5 | uVar4),0);
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size, std::pair<index_t, value_t>&) {
		// The index starts at -1, so the first cell gets index 0
		current_index++;

		value_t nf = 0.0f;

		if (filtration_algorithm != nullptr) {
			directed_flag_complex_cell_t cell(first_vertex);
			if (cell_hasher_t::dimension != size - 2) cell_hasher_t::set_current_cell_dimension(size - 2);

			if (filtration_algorithm->needs_face_filtration()) {
				if (boundary_filtration == nullptr) boundary_filtration = new value_t[size];

				for (int i = 0; i < size; i++) {
					boundary_filtration[i] = complex.get_data(size - 2, cell.boundary(i)).second;
				}

				nf = filtration_algorithm->compute_filtration(size - 1, cell, graph, boundary_filtration);
			} else {
				nf = filtration_algorithm->compute_filtration(size - 1, cell, graph, nullptr);
			}
			next_filtration.push_back(nf);
		}
		complex.set_data(size - 1, first_vertex, std::make_pair(current_index, nf));
	}